

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import.cc
# Opt level: O0

void __thiscall TlbImport::load(TlbImport *this,string *path,config_set *config,Registry *registry)

{
  byte bVar1;
  undefined8 uVar2;
  ImportError *this_00;
  allocator local_2a1;
  string local_2a0 [32];
  char local_280 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260 [48];
  undefined1 local_230 [8];
  ifstream stream;
  Registry *registry_local;
  config_set *config_local;
  string *path_local;
  TlbImport *this_local;
  
  uVar2 = std::__cxx11::string::c_str();
  std::ifstream::ifstream(local_230,uVar2,8);
  bVar1 = std::ios::good();
  if ((bVar1 & 1) == 0) {
    this_00 = (ImportError *)__cxa_allocate_exception(0x60);
    std::operator+(local_280,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "problem opening \'");
    std::operator+(local_260,local_280);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2a0,"",&local_2a1);
    Typelib::ImportError::ImportError(this_00,(string *)local_260,local_2a0,0,0);
    __cxa_throw(this_00,&Typelib::ImportError::typeinfo,Typelib::ImportError::~ImportError);
  }
  (**(code **)((long)*this + 0x10))(this,local_230,config,registry);
  std::ifstream::~ifstream(local_230);
  return;
}

Assistant:

void TlbImport::load
    ( std::string const& path
    , utilmm::config_set const& config
    , Typelib::Registry& registry)
{
    // Loading from files seams to be broken on some distro's libxml2-packages,
    // so we load the whole file into memory before parsing
    std::ifstream stream(path.c_str());
    if (!stream.good())
        throw Parsing::ImportError("problem opening '"+path+"' for import");
    load(stream, config, registry);
}